

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint64_t helper_fmul8x16(uint64_t src1,uint64_t src2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 local_2c;
  short sStack_28;
  short sStack_26;
  uint32_t tmp;
  VIS64 d;
  VIS64 s;
  uint64_t src2_local;
  uint64_t src1_local;
  
  sStack_28 = (short)src2;
  d.b[0] = (uint8_t)src1;
  local_2c = (int)sStack_28 * (uint)d.b[0];
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  uVar1 = local_2c >> 8;
  sStack_26 = (short)(src2 >> 0x10);
  d.b[1] = (uint8_t)(src1 >> 8);
  local_2c = (int)sStack_26 * (uint)d.b[1];
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  uVar2 = local_2c >> 8;
  tmp._0_2_ = (short)(src2 >> 0x20);
  d.b[2] = (uint8_t)(src1 >> 0x10);
  local_2c = (int)(short)tmp * (uint)d.b[2];
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  uVar3 = local_2c >> 8;
  tmp._2_2_ = (short)(src2 >> 0x30);
  d.b[3] = (uint8_t)(src1 >> 0x18);
  local_2c = (int)tmp._2_2_ * (uint)d.b[3];
  if (0x7f < (local_2c & 0xff)) {
    local_2c = local_2c + 0x100;
  }
  _sStack_28 = CONCAT26((short)(local_2c >> 8),
                        CONCAT24((short)uVar3,CONCAT22((short)uVar2,(short)uVar1)));
  return _sStack_28;
}

Assistant:

uint64_t helper_fmul8x16(uint64_t src1, uint64_t src2)
{
    VIS64 s, d;
    uint32_t tmp;

    s.ll = src1;
    d.ll = src2;

#define PMUL(r)                                                 \
    tmp = (int32_t)d.VIS_SW64(r) * (int32_t)s.VIS_B64(r);       \
    if ((tmp & 0xff) > 0x7f) {                                  \
        tmp += 0x100;                                           \
    }                                                           \
    d.VIS_W64(r) = tmp >> 8;

    PMUL(0);
    PMUL(1);
    PMUL(2);
    PMUL(3);
#undef PMUL

    return d.ll;
}